

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O1

void __thiscall
HighsPseudocost::addInferenceObservation
          (HighsPseudocost *this,HighsInt col,HighsInt ninferences,bool upbranch)

{
  double dVar1;
  pointer pdVar2;
  pointer piVar3;
  long lVar4;
  undefined7 in_register_00000009;
  vector<double,_std::allocator<double>_> *pvVar5;
  int iVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  bool bVar8;
  
  lVar4 = this->ninferencestotal + 1;
  this->ninferencestotal = lVar4;
  this->inferences_total =
       ((double)ninferences - this->inferences_total) / (double)lVar4 + this->inferences_total;
  bVar8 = (int)CONCAT71(in_register_00000009,upbranch) != 0;
  pvVar5 = &this->inferencesdown;
  if (bVar8) {
    pvVar5 = &this->inferencesup;
  }
  pdVar2 = (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar2[col];
  pvVar7 = &this->ninferencesup;
  if (!bVar8) {
    pvVar7 = &this->ninferencesdown;
  }
  piVar3 = (pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar6 = piVar3[col] + 1;
  piVar3[col] = iVar6;
  pdVar2[col] = ((double)ninferences - dVar1) / (double)iVar6 + dVar1;
  return;
}

Assistant:

void addInferenceObservation(HighsInt col, HighsInt ninferences,
                               bool upbranch) {
    double d = ninferences - inferences_total;
    ++ninferencestotal;
    inferences_total += d / static_cast<double>(ninferencestotal);
    if (upbranch) {
      d = ninferences - inferencesup[col];
      ninferencesup[col] += 1;
      inferencesup[col] += d / ninferencesup[col];
    } else {
      d = ninferences - inferencesdown[col];
      ninferencesdown[col] += 1;
      inferencesdown[col] += d / ninferencesdown[col];
    }
  }